

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::metatrace::TraceCounter(uint32_t tag,uint16_t id,int32_t value)

{
  uint32_t uVar1;
  Record *this;
  uint64_t ts;
  Record *record;
  __int_type_conflict enabled_tags;
  int32_t value_local;
  uint16_t id_local;
  uint32_t tag_local;
  memory_order __b;
  memory_order __b_1;
  
  ::std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((g_enabled_tags & tag) != 0) {
    this = RingBuffer::AppendNewRecord();
    uVar1 = perfetto::base::GetThreadId();
    this->thread_id = uVar1;
    ts = TraceTimeNowNs();
    Record::set_timestamp(this,ts);
    (this->field_4).counter_value = value;
    ::std::operator&(memory_order_release,__memory_order_mask);
    (this->type_and_id).super___atomic_base<unsigned_short>._M_i = id | 0x8000;
  }
  return;
}

Assistant:

inline void TraceCounter(uint32_t tag, uint16_t id, int32_t value) {
  // memory_order_relaxed is okay because the storage has static lifetime.
  // It is safe to accidentally log an event soon after disabling.
  auto enabled_tags = g_enabled_tags.load(std::memory_order_relaxed);
  if (PERFETTO_LIKELY((enabled_tags & tag) == 0))
    return;
  Record* record = RingBuffer::AppendNewRecord();
  record->thread_id = static_cast<uint32_t>(base::GetThreadId());
  record->set_timestamp(TraceTimeNowNs());
  record->counter_value = value;
  record->type_and_id.store(Record::kTypeCounter | id,
                            std::memory_order_release);
}